

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * Path::ext(string *__return_storage_ptr__,string *path)

{
  allocator local_21;
  long local_20;
  size_type index;
  string *path_local;
  
  index = (size_type)path;
  path_local = __return_storage_ptr__;
  local_20 = std::__cxx11::string::find_last_of((char)path,0x2e);
  if (local_20 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,index);
  }
  return __return_storage_ptr__;
}

Assistant:

string ext(const string &path)
{
	auto index = path.find_last_of('.');
	if (index == string::npos)
		return "";
	else
		return path.substr(index + 1, string::npos);
}